

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O0

void __thiscall
cppcms::crypto::hmac::hmac
          (hmac *this,
          unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
          *digest,key *k)

{
  int iVar1;
  pointer pmVar2;
  invalid_argument *this_00;
  undefined4 extraout_var;
  hmac *in_RDI;
  unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
  *__p;
  unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
  *in_stack_ffffffffffffff60;
  unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
  *this_01;
  string *in_stack_ffffffffffffff68;
  key *in_stack_ffffffffffffff70;
  allocator local_49;
  string local_48 [72];
  EVP_PKEY_CTX *ctx;
  
  booster::noncopyable::noncopyable((noncopyable *)in_RDI);
  booster::hold_ptr<cppcms::crypto::hmac::data_>::hold_ptr(&in_RDI->d);
  std::
  unique_ptr<cppcms::crypto::message_digest,std::default_delete<cppcms::crypto::message_digest>>::
  unique_ptr<std::default_delete<cppcms::crypto::message_digest>,void>(in_stack_ffffffffffffff60);
  std::
  unique_ptr<cppcms::crypto::message_digest,std::default_delete<cppcms::crypto::message_digest>>::
  unique_ptr<std::default_delete<cppcms::crypto::message_digest>,void>(in_stack_ffffffffffffff60);
  crypto::key::key(in_stack_ffffffffffffff70,(key *)in_stack_ffffffffffffff68);
  pmVar2 = std::
           unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
           ::get(in_stack_ffffffffffffff60);
  if (pmVar2 == (pointer)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"Has algorithm is not provided",&local_49);
    booster::invalid_argument::invalid_argument(this_00,in_stack_ffffffffffffff68);
    __cxa_throw(this_00,&booster::invalid_argument::typeinfo,
                booster::invalid_argument::~invalid_argument);
  }
  __p = &in_RDI->md_;
  std::
  unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>::
  operator=(in_stack_ffffffffffffff60,__p);
  this_01 = &in_RDI->md_opad_;
  pmVar2 = std::
           unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
           ::operator->((unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
                         *)0x453492);
  iVar1 = (*pmVar2->_vptr_message_digest[6])();
  ctx = (EVP_PKEY_CTX *)CONCAT44(extraout_var,iVar1);
  std::
  unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>::
  reset(this_01,(pointer)__p);
  init(in_RDI,ctx);
  return;
}

Assistant:

hmac::hmac(std::unique_ptr<message_digest> digest,key const &k) : key_(k)
	{
		if(!digest.get())
			throw booster::invalid_argument("Has algorithm is not provided");
		md_ = std::move(digest);
		md_opad_.reset(md_->clone());
		init();
	}